

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

int PHYSFS_ucs4stricmp(PHYSFS_uint32 *str1,PHYSFS_uint32 *str2)

{
  uint uVar1;
  uint uVar2;
  PHYSFS_uint32 PVar3;
  int iVar4;
  int in_EAX;
  int iVar5;
  int iVar6;
  long lVar7;
  PHYSFS_uint32 *pPVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  uint *local_58;
  uint *local_50;
  PHYSFS_uint32 local_48 [6];
  
  iVar5 = 0;
  iVar11 = 0;
  iVar6 = 0;
  iVar10 = 0;
  local_58 = str1;
  local_50 = str2;
  do {
    if (iVar5 == iVar11) {
      uVar1 = *local_58;
      PVar3 = uVar1;
      if (0x10fff < uVar1) {
        PVar3 = 0x3f;
      }
      local_58 = local_58 + (uVar1 != 0);
      pPVar8 = local_48 + 3;
      iVar5 = PHYSFS_caseFold(PVar3,pPVar8);
      iVar11 = 1;
    }
    else {
      lVar7 = (long)iVar11;
      iVar11 = iVar11 + 1;
      pPVar8 = local_48 + lVar7 + 3;
    }
    uVar1 = *pPVar8;
    if (iVar6 == iVar10) {
      uVar2 = *local_50;
      PVar3 = uVar2;
      if (0x10fff < uVar2) {
        PVar3 = 0x3f;
      }
      local_50 = local_50 + (uVar2 != 0);
      pPVar8 = local_48;
      iVar6 = PHYSFS_caseFold(PVar3,pPVar8);
      iVar10 = 1;
    }
    else {
      lVar7 = (long)iVar10;
      iVar10 = iVar10 + 1;
      pPVar8 = local_48 + lVar7;
    }
    if (uVar1 < *pPVar8) {
      cVar9 = '\x01';
      iVar4 = -1;
    }
    else {
      cVar9 = '\x01';
      iVar4 = 1;
      if (uVar1 <= *pPVar8) {
        cVar9 = (uVar1 == 0) * '\x03';
        iVar4 = in_EAX;
      }
    }
    in_EAX = iVar4;
  } while (cVar9 == '\0');
  if (cVar9 == '\x03') {
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

int PHYSFS_ucs4stricmp(const PHYSFS_uint32 *str1, const PHYSFS_uint32 *str2)
{
    UTFSTRICMP(32);
}